

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compound_type.c
# Opt level: O3

int64_t pick_wedge_fixed_sign
                  (AV1_COMP *cpi,MACROBLOCK *x,BLOCK_SIZE bsize,int16_t *residual1,int16_t *diff10,
                  int8_t wedge_sign,int8_t *best_wedge_index,uint64_t *best_sse)

{
  byte bVar1;
  byte bVar2;
  long lVar3;
  int iVar4;
  uint64_t uVar5;
  byte bVar6;
  byte bVar7;
  long lVar8;
  char cVar9;
  undefined7 in_register_00000011;
  char cVar10;
  int iVar11;
  undefined7 in_register_00000089;
  long lVar12;
  ulong uVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dist_by_sse_norm_f;
  double rate_f;
  double local_40;
  double local_38;
  
  iVar11 = (int)x;
  bVar6 = 0;
  if ((*(byte *)(*(long *)((cpi->enc_quant_dequant_params).quants.y_zbin[10] + 4) + 0xc0) & 8) != 0)
  {
    bVar6 = (char)*(undefined4 *)(cpi->enc_quant_dequant_params).quants.y_zbin[0xb3] * '\x02' - 0x10
    ;
  }
  lVar12 = 0x7fffffffffffffff;
  cVar9 = (char)*(undefined4 *)
                 ((long)&av1_wedge_params_lookup[0].wedge_types + (ulong)(uint)(iVar11 << 5));
  if ('\0' < cVar9) {
    bVar1 = block_size_wide[(ulong)x & 0xffffffff];
    bVar2 = block_size_high[(ulong)x & 0xffffffff];
    dVar14 = (double)((uint)bVar2 * (uint)bVar1);
    cVar10 = '\0';
    lVar3 = *(long *)((long)&av1_wedge_params_lookup[0].masks + (ulong)(uint)(iVar11 << 5));
    do {
      uVar5 = (*av1_wedge_sse_from_residuals)
                        ((int16_t *)CONCAT71(in_register_00000011,bsize),residual1,
                         *(uint8_t **)((long)(char)diff10 * 0x80 + lVar3 + (long)cVar10 * 8),
                         (uint)bVar2 * (uint)bVar1);
      uVar13 = uVar5 + (long)((1 << (bVar6 & 0x1f)) >> 1) >> (bVar6 & 0x3f);
      bVar7 = 3;
      if ((*(byte *)(*(long *)((cpi->enc_quant_dequant_params).quants.y_zbin[10] + 4) + 0xc0) & 8)
          != 0) {
        bVar7 = (char)*(undefined4 *)(cpi->enc_quant_dequant_params).quants.y_zbin[0xb3] - 5;
      }
      if (uVar13 == 0) {
        iVar4 = 0;
        lVar8 = 0;
      }
      else {
        iVar4 = (int)*(short *)(*(long *)(cpi->enc_quant_dequant_params).quants.y_quant[7] + 2) >>
                (bVar7 & 0x1f);
        if (iVar4 < 2) {
          iVar4 = 1;
        }
        dVar15 = (double)(long)uVar13 / dVar14;
        dVar16 = log2(dVar15 / ((double)iVar4 * (double)iVar4));
        av1_model_rd_curvfit((BLOCK_SIZE)x,dVar15,dVar16,&local_38,&local_40);
        dVar16 = 0.0;
        if (0.0 <= local_38 * dVar14) {
          dVar16 = local_38 * dVar14;
        }
        iVar4 = (int)(dVar16 + 0.5);
        if (iVar4 == 0) {
LAB_003bd83e:
          lVar8 = uVar13 << 4;
          iVar4 = 0;
        }
        else {
          dVar15 = dVar15 * local_40 * dVar14;
          dVar16 = 0.0;
          if (0.0 <= dVar15) {
            dVar16 = dVar15;
          }
          lVar8 = (long)(dVar16 + 0.5);
          if ((long)(uVar13 * 0x800) <=
              lVar8 * 0x80 +
              ((long)*(int *)((cpi->enc_quant_dequant_params).quants.y_quant_fp[0x20] + 4) *
               (long)iVar4 + 0x100 >> 9)) goto LAB_003bd83e;
        }
        lVar8 = lVar8 << 7;
      }
      lVar8 = ((long)*(int *)((cpi->enc_quant_dequant_params).quants.y_quant_fp[0x20] + 4) *
               ((long)iVar4 +
               (long)*(int *)((long)(cpi->enc_quant_dequant_params).quants.u_round_fp[0x30] +
                             (long)cVar10 * 4 + (ulong)(uint)(iVar11 << 6) + 8)) + 0x100 >> 9) +
              lVar8;
      if (lVar8 < lVar12) {
        *(char *)CONCAT71(in_register_00000089,wedge_sign) = cVar10;
        *(ulong *)best_wedge_index = uVar13;
        lVar12 = lVar8;
      }
      cVar10 = cVar10 + '\x01';
    } while (cVar10 < cVar9);
  }
  return lVar12 - ((long)*(int *)((cpi->enc_quant_dequant_params).quants.y_quant_fp[0x20] + 4) *
                   (long)*(int *)((long)(cpi->enc_quant_dequant_params).quants.u_round_fp[0x30] +
                                 (long)*(char *)CONCAT71(in_register_00000089,wedge_sign) * 4 +
                                 (ulong)(uint)(iVar11 << 6) + 8) + 0x100 >> 9);
}

Assistant:

static int64_t pick_wedge_fixed_sign(
    const AV1_COMP *const cpi, const MACROBLOCK *const x,
    const BLOCK_SIZE bsize, const int16_t *const residual1,
    const int16_t *const diff10, const int8_t wedge_sign,
    int8_t *const best_wedge_index, uint64_t *best_sse) {
  const MACROBLOCKD *const xd = &x->e_mbd;

  const int bw = block_size_wide[bsize];
  const int bh = block_size_high[bsize];
  const int N = bw * bh;
  assert(N >= 64);
  int rate;
  int64_t dist;
  int64_t rd, best_rd = INT64_MAX;
  int8_t wedge_index;
  const int8_t wedge_types = get_wedge_types_lookup(bsize);
  const uint8_t *mask;
  uint64_t sse;
  const int hbd = is_cur_buf_hbd(xd);
  const int bd_round = hbd ? (xd->bd - 8) * 2 : 0;
  for (wedge_index = 0; wedge_index < wedge_types; ++wedge_index) {
    mask = av1_get_contiguous_soft_mask(wedge_index, wedge_sign, bsize);
    sse = av1_wedge_sse_from_residuals(residual1, diff10, mask, N);
    sse = ROUND_POWER_OF_TWO(sse, bd_round);

    model_rd_sse_fn[MODELRD_TYPE_MASKED_COMPOUND](cpi, x, bsize, 0, sse, N,
                                                  &rate, &dist);
    rate += x->mode_costs.wedge_idx_cost[bsize][wedge_index];
    rd = RDCOST(x->rdmult, rate, dist);

    if (rd < best_rd) {
      *best_wedge_index = wedge_index;
      best_rd = rd;
      *best_sse = sse;
    }
  }
  return best_rd -
         RDCOST(x->rdmult,
                x->mode_costs.wedge_idx_cost[bsize][*best_wedge_index], 0);
}